

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::put_immutable_item
          (dht_default_storage *this,sha1_hash *target,span<const_char> buf,address *addr)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_iterator __position;
  pointer ppVar4;
  ulong uVar5;
  __enable_if_t<is_constructible<value_type,_pair<digest32<160L>,_dht_immutable_item>_>::value,_pair<iterator,_bool>_>
  _Var6;
  span<const_char> buf_00;
  tuple<std::_Rb_tree_iterator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_immutable_item>>&,std::_Swallow_assign_const&>
  local_1f0 [16];
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  pair<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>
  local_1d0;
  pair<std::_Rb_tree_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>,_bool>
  local_120 [2];
  dht_immutable_item *local_100;
  char *local_f8;
  undefined1 local_f0 [8];
  dht_immutable_item to_add;
  const_iterator j;
  _Self local_38;
  iterator i;
  address *addr_local;
  sha1_hash *target_local;
  dht_default_storage *this_local;
  span<const_char> buf_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (dht_default_storage *)buf.m_ptr;
  i._M_node = (_Base_ptr)addr;
  local_38._M_node =
       (_Base_ptr)
       ::std::
       map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
       ::find(&this->m_immutable_table,target);
  j._M_node = (_Base_ptr)
              ::std::
              map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
              ::end(&this->m_immutable_table);
  bVar1 = ::std::operator==(&local_38,(_Self *)&j);
  if (bVar1) {
    sVar3 = ::std::
            map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
            ::size(&this->m_immutable_table);
    uVar2 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x408d);
    if ((int)uVar2 <= (int)sVar3) {
      __position = pick_least_important_item<libtorrent::dht::(anonymous_namespace)::dht_immutable_item>
                             (&this->m_node_ids,&this->m_immutable_table);
      to_add._144_8_ =
           ::std::
           map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>_>
           ::erase(&this->m_immutable_table,__position);
      uVar2 = (this->m_counters).immutable_data - 1;
      (this->m_counters).immutable_data = uVar2;
    }
    uVar5 = (ulong)uVar2;
    dht_immutable_item::dht_immutable_item((dht_immutable_item *)local_f0);
    span<char_const>::span<libtorrent::span<char_const>,char_const,void>
              ((span<char_const> *)&local_100,(span<const_char> *)&this_local);
    buf_00.m_len = uVar5;
    buf_00.m_ptr = local_f8;
    set_value((anon_unknown_0 *)local_f0,local_100,buf_00);
    ::std::
    make_pair<libtorrent::digest32<160l>const&,libtorrent::dht::(anonymous_namespace)::dht_immutable_item>
              (&local_1d0,target,(dht_immutable_item *)local_f0);
    _Var6 = ::std::
            map<libtorrent::digest32<160l>,libtorrent::dht::(anonymous_namespace)::dht_immutable_item,std::less<libtorrent::digest32<160l>>,std::allocator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_immutable_item>>>
            ::
            insert<std::pair<libtorrent::digest32<160l>,libtorrent::dht::(anonymous_namespace)::dht_immutable_item>>
                      ((map<libtorrent::digest32<160l>,libtorrent::dht::(anonymous_namespace)::dht_immutable_item,std::less<libtorrent::digest32<160l>>,std::allocator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_immutable_item>>>
                        *)&this->m_immutable_table,&local_1d0);
    local_1e0 = (_Base_ptr)_Var6.first._M_node;
    local_1d8 = _Var6.second;
    local_120[0].first._M_node = local_1e0;
    local_120[0].second = (bool)local_1d8;
    ::std::
    tie<std::_Rb_tree_iterator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_immutable_item>>,std::_Swallow_assign_const>
              ((_Rb_tree_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>
                *)local_1f0,(_Swallow_assign *)&local_38);
    ::std::
    tuple<std::_Rb_tree_iterator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_immutable_item>>&,std::_Swallow_assign_const&>
    ::operator=(local_1f0,local_120);
    ::std::
    pair<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>::
    ~pair(&local_1d0);
    (this->m_counters).immutable_data = (this->m_counters).immutable_data + 1;
    dht_immutable_item::~dht_immutable_item((dht_immutable_item *)local_f0);
  }
  ppVar4 = ::std::
           _Rb_tree_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_immutable_item>_>
           ::operator->(&local_38);
  touch_item(&ppVar4->second,(address *)i._M_node);
  return;
}

Assistant:

void put_immutable_item(sha1_hash const& target
			, span<char const> buf
			, address const& addr) override
		{
			TORRENT_ASSERT(!m_node_ids.empty());
			auto i = m_immutable_table.find(target);
			if (i == m_immutable_table.end())
			{
				// make sure we don't add too many items
				if (int(m_immutable_table.size()) >= m_settings.get_int(settings_pack::dht_max_dht_items))
				{
					auto const j = pick_least_important_item(m_node_ids
						, m_immutable_table);

					TORRENT_ASSERT(j != m_immutable_table.end());
					m_immutable_table.erase(j);
					m_counters.immutable_data -= 1;
				}
				dht_immutable_item to_add;
				set_value(to_add, buf);

				std::tie(i, std::ignore) = m_immutable_table.insert(
					std::make_pair(target, std::move(to_add)));
				m_counters.immutable_data += 1;
			}

//			std::fprintf(stderr, "added immutable item (%d)\n", int(m_immutable_table.size()));

			touch_item(i->second, addr);
		}